

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMImage * MT32Emu::ROMImage::appendImages(ROMImage *romImageLow,ROMImage *romImageHigh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bit8u *data;
  ROMImage *romImage;
  size_t __n;
  
  iVar1 = (*romImageLow->file->_vptr_File[3])();
  iVar2 = (*romImageHigh->file->_vptr_File[3])();
  iVar3 = (*romImageLow->file->_vptr_File[2])();
  __n = CONCAT44(extraout_var_01,iVar3);
  data = (Bit8u *)operator_new__(__n * 2);
  memcpy(data,(void *)CONCAT44(extraout_var,iVar1),__n);
  memcpy(data + __n,(void *)CONCAT44(extraout_var_00,iVar2),__n);
  romImage = makeFullROMImage(data,__n * 2);
  if (romImage->romInfo == (ROMInfo *)0x0) {
    freeROMImage(romImage);
    romImage = (ROMImage *)0x0;
  }
  return romImage;
}

Assistant:

const ROMImage *ROMImage::appendImages(const ROMImage *romImageLow, const ROMImage *romImageHigh) {
	const Bit8u *romDataLow = romImageLow->getFile()->getData();
	const Bit8u *romDataHigh = romImageHigh->getFile()->getData();
	size_t partSize = romImageLow->getFile()->getSize();
	Bit8u *data = new Bit8u[2 * partSize];
	memcpy(data, romDataLow, partSize);
	memcpy(data + partSize, romDataHigh, partSize);
	const ROMImage *romImageFull = makeFullROMImage(data, 2 * partSize);
	if (romImageFull->getROMInfo() == NULL) {
		freeROMImage(romImageFull);
		return NULL;
	}
	return romImageFull;
}